

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.h
# Opt level: O2

void chrono::StreamSwapBytes<unsigned_long>(unsigned_long *ptData)

{
  unsigned_long uVar1;
  int i1;
  long lVar2;
  unsigned_long *puVar3;
  
  puVar3 = ptData;
  for (lVar2 = 7; lVar2 != 3; lVar2 = lVar2 + -1) {
    uVar1 = *puVar3;
    *(undefined1 *)puVar3 = *(undefined1 *)((long)ptData + lVar2);
    *(char *)((long)ptData + lVar2) = (char)uVar1;
    puVar3 = (unsigned_long *)((long)puVar3 + 1);
  }
  return;
}

Assistant:

inline void StreamSwapBytes(T* ptData) {
    char* acBytes = (char*)ptData;
    int iSize = (int)(sizeof(T));
    int iSizeM1 = iSize - 1;
    int iHSize = iSize / 2;
    for (int i0 = 0, i1 = iSizeM1; i0 < iHSize; i0++, i1--) {
        char cSave = acBytes[i0];
        acBytes[i0] = acBytes[i1];
        acBytes[i1] = cSave;
    }
}